

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ParseResult *
read_quoted(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,string *form)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  string *psVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Node *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  shared_ptr<ASTNode> quote;
  shared_ptr<ASTNode> local_70;
  ParseResult local_60;
  
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017a300;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 0;
  *(_Atomic_word **)
   &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count =
       &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
        _M_use_count;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)
   &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
    _M_use_count = 0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3]._M_use_count
       = 0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _M_weak_count = 0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base =
       (_func_int **)
       &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count;
  *(_Atomic_word **)
   &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
    _M_use_count =
       &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
        _M_use_count;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4]._M_use_count
       = 0;
  local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _M_weak_count = 0;
  *(undefined4 *)
   &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = 1;
  std::__cxx11::string::_M_assign
            ((string *)
             &local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
              _M_use_count);
  peVar3 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar3->type = LIST;
  p_Var7 = std::__cxx11::list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>>::
           _M_create_node<std::shared_ptr<ASTNode>const&>
                     ((list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>> *)
                      &peVar3->list,&local_70);
  std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
  psVar1 = &(peVar3->list).
            super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  read_object(&local_60,is);
  _Var6._M_pi = local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_60.result == OK) {
    peVar3 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var7 = std::__cxx11::list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>>::
             _M_create_node<std::shared_ptr<ASTNode>const&>
                       ((list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>> *)
                        &peVar3->list,&local_60.node);
    std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
    psVar1 = &(peVar3->list).
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    peVar3 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var4 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    __return_storage_ptr__->result = OK;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar3;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    paVar8 = &(__return_storage_ptr__->error).field_2;
    (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar8;
    psVar5 = &__return_storage_ptr__->error;
  }
  else {
    __return_storage_ptr__->result = local_60.result;
    paVar8 = &local_60.error.field_2;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var6._M_pi;
    local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    paVar2 = &(__return_storage_ptr__->error).field_2;
    (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.error._M_dataplus._M_p == paVar8) {
      paVar2->_M_allocated_capacity = local_60.error.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) =
           local_60.error.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->error)._M_dataplus._M_p = local_60.error._M_dataplus._M_p;
      (__return_storage_ptr__->error).field_2._M_allocated_capacity =
           local_60.error.field_2._M_allocated_capacity;
    }
    psVar5 = &local_60.error;
    (__return_storage_ptr__->error)._M_string_length = local_60.error._M_string_length;
    local_60.error._M_dataplus._M_p = (pointer)paVar8;
  }
  psVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.error._M_dataplus._M_p != &local_60.error.field_2) {
    operator_delete(local_60.error._M_dataplus._M_p,local_60.error.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

static ParseResult read_quoted(std::istream &is, const std::shared_ptr<ASTNode> &node, const std::string &form)
{
    auto quote = std::make_shared<ASTNode>();
    quote->type = ast_type_t::NAME;
    quote->value = form;
    node->type = ast_type_t::LIST;
    node->list.push_back(quote);
    auto object = read_object(is);
    if(object.result == parse_result_t::OK)
    {
        node->list.push_back(object.node);
        return node;
    }
    return object;
}